

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O0

void __thiscall Assimp::MDL::IntBone_MDL7::IntBone_MDL7(IntBone_MDL7 *this)

{
  IntBone_MDL7 *this_local;
  
  aiBone::aiBone(&this->super_aiBone);
  this->iParent = 0xffff;
  aiVector3t<float>::aiVector3t(&this->vPosition);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector(&this->pkeyPositions);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector(&this->pkeyScalings);
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::vector(&this->pkeyRotations);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->pkeyPositions,0x1e);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->pkeyScalings,0x1e);
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve(&this->pkeyRotations,0x1e);
  return;
}

Assistant:

IntBone_MDL7() AI_NO_EXCEPT : iParent (0xffff)
    {
        pkeyPositions.reserve(30);
        pkeyScalings.reserve(30);
        pkeyRotations.reserve(30);
    }